

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int gen_nested_loop_label_p(gen_ctx_t gen_ctx,MIR_insn_t insn)

{
  loop_node_t plVar1;
  loop_node_t plVar2;
  bb_t_conflict pbVar3;
  DLIST_loop_node_t *pDVar4;
  
  if (*(int *)&insn->field_0x18 != 0xb4) {
    __assert_fail("insn->code == MIR_LABEL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2db,"int gen_nested_loop_label_p(gen_ctx_t, MIR_insn_t)");
  }
  if (1 < gen_ctx->optimize_level) {
    pbVar3 = get_insn_bb(gen_ctx,insn);
    if (pbVar3->loop_node != (loop_node_t_conflict)0x0) {
      plVar1 = pbVar3->loop_node->parent;
      plVar2 = plVar1->entry;
      if ((plVar2 != (loop_node_t)0x0) && (plVar2->bb == pbVar3)) {
        pDVar4 = &plVar1->children;
        do {
          plVar1 = pDVar4->head;
          if (plVar1 == (loop_node_t)0x0) {
            return 1;
          }
          pDVar4 = (DLIST_loop_node_t *)&(plVar1->children_link).next;
        } while (plVar1->bb != (bb_t)0x0);
      }
    }
  }
  return 0;
}

Assistant:

static int MIR_UNUSED gen_nested_loop_label_p (gen_ctx_t gen_ctx, MIR_insn_t insn) {
  gen_assert (insn->code == MIR_LABEL);
  if (optimize_level <= 1) return FALSE;
  bb_t bb = get_insn_bb (gen_ctx, insn);
  if (bb->loop_node == NULL) return FALSE;
  loop_node_t node, parent = bb->loop_node->parent;
  if (parent->entry == NULL || parent->entry->bb != bb) return FALSE;
  for (node = DLIST_HEAD (loop_node_t, parent->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) return FALSE; /* subloop */
  return TRUE;
}